

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O3

char * lj_strfmt_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  SBuf *sb;
  undefined4 uVar1;
  TValue *pTVar2;
  int iVar3;
  uint sf;
  size_t sVar4;
  long *plVar5;
  lua_Number *plVar6;
  undefined4 *puVar7;
  undefined8 *puVar8;
  char *pcVar9;
  GCstr *pGVar10;
  uint uVar11;
  uint *puVar12;
  int *piVar13;
  MSize len;
  uint64_t k;
  ulong uVar14;
  uint uVar15;
  FormatState fs;
  FormatState local_50;
  
  uVar14 = (ulong)(L->glref).ptr32;
  *(int *)(uVar14 + 0xf4) = (int)L;
  uVar15 = *(uint *)(uVar14 + 0xf0);
  *(uint *)(uVar14 + 0xe8) = uVar15;
  sVar4 = strlen(fmt);
  local_50.e = (uint8_t *)(fmt + (sVar4 & 0xffffffff));
  local_50.p = (uint8_t *)fmt;
  sf = lj_strfmt_parse(&local_50);
  uVar11 = uVar15;
  if (sf != 0) {
    sb = (SBuf *)(uVar14 + 0xe8);
    do {
      switch(sf & 0xf) {
      case 2:
        pcVar9 = local_50.str;
        len = local_50.len;
        goto LAB_00114013;
      case 3:
        uVar15 = argp->gp_offset;
        if ((ulong)uVar15 < 0x29) {
          piVar13 = (int *)((ulong)uVar15 + (long)argp->reg_save_area);
          argp->gp_offset = uVar15 + 8;
        }
        else {
          piVar13 = (int *)argp->overflow_arg_area;
          argp->overflow_arg_area = piVar13 + 2;
        }
        k = (uint64_t)*piVar13;
        goto LAB_0011405b;
      case 4:
        uVar15 = argp->gp_offset;
        if ((ulong)uVar15 < 0x29) {
          puVar12 = (uint *)((ulong)uVar15 + (long)argp->reg_save_area);
          argp->gp_offset = uVar15 + 8;
        }
        else {
          puVar12 = (uint *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar12 + 2;
        }
        k = (uint64_t)*puVar12;
LAB_0011405b:
        lj_strfmt_putfxint(sb,sf,k);
        break;
      case 5:
        uVar15 = argp->fp_offset;
        if ((ulong)uVar15 < 0xa1) {
          plVar6 = (lua_Number *)((ulong)uVar15 + (long)argp->reg_save_area);
          argp->fp_offset = uVar15 + 0x10;
        }
        else {
          plVar6 = (lua_Number *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar6 + 1;
        }
        lj_strfmt_putfnum(sb,0xf000035,*plVar6);
        break;
      case 6:
        uVar15 = argp->gp_offset;
        if ((ulong)uVar15 < 0x29) {
          plVar5 = (long *)((ulong)uVar15 + (long)argp->reg_save_area);
          argp->gp_offset = uVar15 + 8;
        }
        else {
          plVar5 = (long *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar5 + 1;
        }
        pcVar9 = (char *)*plVar5;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = "(null)";
        }
        sVar4 = strlen(pcVar9);
        len = (MSize)sVar4;
LAB_00114013:
        lj_buf_putmem(sb,pcVar9,len);
        break;
      case 7:
        uVar15 = argp->gp_offset;
        if ((ulong)uVar15 < 0x29) {
          puVar7 = (undefined4 *)((ulong)uVar15 + (long)argp->reg_save_area);
          argp->gp_offset = uVar15 + 8;
        }
        else {
          puVar7 = (undefined4 *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar7 + 2;
        }
        uVar1 = *puVar7;
        pcVar9 = (char *)(ulong)*(uint *)(uVar14 + 0xe8);
        if (*(uint *)(uVar14 + 0xec) == *(uint *)(uVar14 + 0xe8)) {
          pcVar9 = lj_buf_more2(sb,1);
        }
        iVar3 = (int)pcVar9;
        *pcVar9 = (char)uVar1;
        goto LAB_0011408a;
      case 8:
        uVar15 = argp->gp_offset;
        if ((ulong)uVar15 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar15 + (long)argp->reg_save_area);
          argp->gp_offset = uVar15 + 8;
        }
        else {
          puVar8 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar8 + 1;
        }
        lj_strfmt_putptr(sb,(void *)*puVar8);
        break;
      default:
        pcVar9 = (char *)(ulong)*(uint *)(uVar14 + 0xe8);
        if (*(uint *)(uVar14 + 0xec) == *(uint *)(uVar14 + 0xe8)) {
          pcVar9 = lj_buf_more2(sb,1);
        }
        iVar3 = (int)pcVar9;
        *pcVar9 = '?';
LAB_0011408a:
        (sb->p).ptr32 = iVar3 + 1;
      }
      sf = lj_strfmt_parse(&local_50);
    } while (sf != 0);
    uVar15 = *(uint *)(uVar14 + 0xe8);
    uVar11 = *(uint *)(uVar14 + 0xf0);
  }
  pGVar10 = lj_str_new(L,(char *)(ulong)uVar11,(ulong)(uVar15 - uVar11));
  pTVar2 = L->top;
  (pTVar2->u32).lo = (uint32_t)pGVar10;
  (pTVar2->field_2).it = 0xfffffffb;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar2 + 1) {
    lj_state_growstack1(L);
  }
  return (char *)(pGVar10 + 1);
}

Assistant:

const char *lj_strfmt_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = lj_buf_tmp_(L);
  FormatState fs;
  SFormat sf;
  GCstr *str;
  lj_strfmt_init(&fs, fmt, (MSize)strlen(fmt));
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      lj_buf_putmem(sb, fs.str, fs.len);
      break;
    case STRFMT_INT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, int32_t));
      break;
    case STRFMT_UINT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, uint32_t));
      break;
    case STRFMT_NUM:
      lj_strfmt_putfnum(sb, STRFMT_G14, va_arg(argp, lua_Number));
      break;
    case STRFMT_STR: {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      lj_buf_putmem(sb, s, (MSize)strlen(s));
      break;
      }
    case STRFMT_CHAR:
      lj_buf_putb(sb, va_arg(argp, int));
      break;
    case STRFMT_PTR:
      lj_strfmt_putptr(sb, va_arg(argp, void *));
      break;
    case STRFMT_ERR:
    default:
      lj_buf_putb(sb, '?');
      lj_assertL(0, "bad string format near offset %d", fs.len);
      break;
    }
  }
  str = lj_buf_str(L, sb);
  setstrV(L, L->top, str);
  incr_top(L);
  return strdata(str);
}